

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O3

bool __thiscall tcu::CasePaths::matches(CasePaths *this,string *caseName,bool allowPrefix)

{
  pointer pbVar1;
  const_iterator pathStart;
  size_type sVar2;
  const_iterator cVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  size_type *psVar8;
  long lVar9;
  ulong uVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  components;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  de::splitString(&local_48,caseName,'.');
  pbVar1 = (this->m_casePatterns).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(this->m_casePatterns).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar9 == 0) {
    bVar6 = false;
  }
  else {
    uVar10 = lVar9 >> 5;
    pathStart._M_current = (caseName->_M_dataplus)._M_p;
    sVar2 = caseName->_M_string_length;
    cVar3._M_current = (pbVar1->_M_dataplus)._M_p;
    bVar5 = matchWildcards(cVar3,(const_iterator)(cVar3._M_current + pbVar1->_M_string_length),
                           pathStart,(const_iterator)(pathStart._M_current + sVar2),allowPrefix);
    bVar6 = true;
    if (!bVar5) {
      psVar8 = &pbVar1[1]._M_string_length;
      uVar4 = 1;
      do {
        uVar7 = uVar4;
        if (uVar10 + (uVar10 == 0) == uVar7) break;
        cVar3._M_current =
             (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(psVar8 + -1))->
             _M_dataplus)._M_p;
        bVar6 = matchWildcards(cVar3,(const_iterator)(cVar3._M_current + *psVar8),pathStart,
                               (const_iterator)(pathStart._M_current + sVar2),allowPrefix);
        psVar8 = psVar8 + 4;
        uVar4 = uVar7 + 1;
      } while (!bVar6);
      bVar6 = uVar7 < uVar10;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return bVar6;
}

Assistant:

bool CasePaths::matches (const string& caseName, bool allowPrefix) const
{
	const vector<string> components = de::splitString(caseName, '.');

	for (size_t ndx = 0; ndx < m_casePatterns.size(); ++ndx)
	{
#if defined(TCU_HIERARCHICAL_CASEPATHS)
		const vector<string> patternComponents = de::splitString(m_casePatterns[ndx], '.');

		if (patternMatches(patternComponents.begin(), patternComponents.end(),
						   components.begin(), components.end(), allowPrefix))
			return true;
#else
		if (matchWildcards(m_casePatterns[ndx].begin(), m_casePatterns[ndx].end(),
						   caseName.begin(), caseName.end(), allowPrefix))
			return true;
#endif
	}

	return false;
}